

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

EulerAngles * __thiscall
KDIS::UTILS::DeadReckoningCalculator::toEulerAngularVelocity
          (EulerAngles *__return_storage_ptr__,DeadReckoningCalculator *this,Vector *angVel,
          EulerAngles *Orientation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  KFLOAT32 *pKVar4;
  KFLOAT32 __x;
  KFLOAT32 __x_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  __x = DATA_TYPE::EulerAngles::GetPhiInRadians(Orientation);
  __x_00 = DATA_TYPE::EulerAngles::GetThetaInRadians(Orientation);
  DATA_TYPE::EulerAngles::GetPsiInRadians(Orientation);
  fVar5 = cosf((float)__x);
  fVar6 = sinf((float)__x);
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,1);
  fVar1 = (float)*pKVar4;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,2);
  fVar2 = (float)*pKVar4;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,1);
  fVar3 = (float)*pKVar4;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,2);
  fVar8 = (float)*pKVar4;
  fVar7 = cosf((float)__x_00);
  fVar7 = (fVar5 * fVar8 + fVar6 * fVar3) / fVar7;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,0);
  fVar3 = (float)*pKVar4;
  fVar8 = sinf((float)__x_00);
  DATA_TYPE::EulerAngles::EulerAngles
            (__return_storage_ptr__,(KFLOAT32)fVar7,(KFLOAT32)(fVar1 * fVar5 - fVar2 * fVar6),
             (KFLOAT32)(fVar3 + fVar8 * fVar7));
  return __return_storage_ptr__;
}

Assistant:

EulerAngles DeadReckoningCalculator::toEulerAngularVelocity( const Vector & angVel, const EulerAngles & Orientation )
{
    KFLOAT32 dpsi, dtheta, dphi;

    const KFLOAT32 phi = Orientation.GetPhiInRadians();
    const KFLOAT32 theta = Orientation.GetThetaInRadians();
    const KFLOAT32 psi = Orientation.GetPsiInRadians();

    KFLOAT32 cos_phi = cos( phi );
    KFLOAT32 sin_phi = sin( phi );

    dtheta = angVel[1] * cos_phi - angVel[2] * sin_phi;
    dpsi  = ( angVel[1] * sin_phi + angVel[2] * cos_phi ) / cos( theta ); //could be unstable when cos(theta) is close to 0
    dphi = angVel[0] + dpsi * sin( theta );

    return EulerAngles( ( const KFLOAT32 )dpsi, ( const KFLOAT32 )dtheta, ( const KFLOAT32 )dphi );
}